

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::GetDefaultBlindingKeyRequest::ConvertFromStruct
          (GetDefaultBlindingKeyRequest *this,GetDefaultBlindingKeyRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->master_blinding_key_);
  std::__cxx11::string::_M_assign((string *)&this->locking_script_);
  std::__cxx11::string::_M_assign((string *)&this->address_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void GetDefaultBlindingKeyRequest::ConvertFromStruct(
    const GetDefaultBlindingKeyRequestStruct& data) {
  master_blinding_key_ = data.master_blinding_key;
  locking_script_ = data.locking_script;
  address_ = data.address;
  ignore_items = data.ignore_items;
}